

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.cpp
# Opt level: O3

DiffLine *
init_diff_line(DiffLine *__return_storage_ptr__,StatusEnum status_enum,int line_number,string *line)

{
  (__return_storage_ptr__->line)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->line).field_2
  ;
  (__return_storage_ptr__->line)._M_string_length = 0;
  (__return_storage_ptr__->line).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->status_enum = status_enum;
  __return_storage_ptr__->line_number = line_number;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->line);
  return __return_storage_ptr__;
}

Assistant:

DiffLine init_diff_line(StatusEnum status_enum,int line_number, String line){
    DiffLine diff_line;
    diff_line.status_enum = status_enum;
    diff_line.line_number = line_number;
    diff_line.line = line;
    return diff_line;
}